

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.cxx
# Opt level: O3

void __thiscall cmXMLWriter::Comment(cmXMLWriter *this,char *comment)

{
  ostream *poVar1;
  size_t sVar2;
  
  CloseStartElement(this);
  ConditionalLineBreak(this,(bool)(this->IsContent ^ 1));
  poVar1 = this->Output;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"<!-- ",5);
  if (comment == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)poVar1->_vptr_basic_ostream[-3]);
  }
  else {
    sVar2 = strlen(comment);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,comment,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," -->",4);
  return;
}

Assistant:

void cmXMLWriter::Comment(const char* comment)
{
  this->CloseStartElement();
  this->ConditionalLineBreak(!this->IsContent);
  this->Output << "<!-- " << comment << " -->";
}